

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgproperty.cpp
# Opt level: O3

bool __thiscall lunasvg::SVGPointList::parse(SVGPointList *this,string_view input)

{
  pointer *ppPVar1;
  pointer pPVar2;
  iterator __position;
  bool bVar3;
  Point local_48;
  string_view local_40;
  
  local_40._M_str = input._M_str;
  local_40._M_len = input._M_len;
  pPVar2 = (this->m_values).super__Vector_base<lunasvg::Point,_std::allocator<lunasvg::Point>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->m_values).super__Vector_base<lunasvg::Point,_std::allocator<lunasvg::Point>_>._M_impl.
      super__Vector_impl_data._M_finish != pPVar2) {
    (this->m_values).super__Vector_base<lunasvg::Point,_std::allocator<lunasvg::Point>_>._M_impl.
    super__Vector_impl_data._M_finish = pPVar2;
  }
  if (local_40._M_len == 0) {
    return true;
  }
  while (((ulong)(byte)*local_40._M_str < 0x21 &&
         ((0x100002600U >> ((ulong)(byte)*local_40._M_str & 0x3f) & 1) != 0))) {
    local_40._M_str = (char *)((byte *)local_40._M_str + 1);
    local_40._M_len = local_40._M_len - 1;
    if (local_40._M_len == 0) {
      return true;
    }
  }
  do {
    local_48.x = 0.0;
    local_48.y = 0.0;
    bVar3 = parseNumber<float>(&local_40,&local_48.x);
    if (((!bVar3) || (bVar3 = skipOptionalSpacesOrDelimiter(&local_40,','), !bVar3)) ||
       (bVar3 = parseNumber<float>(&local_40,&local_48.y), !bVar3)) {
      return false;
    }
    __position._M_current =
         (this->m_values).super__Vector_base<lunasvg::Point,_std::allocator<lunasvg::Point>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->m_values).super__Vector_base<lunasvg::Point,_std::allocator<lunasvg::Point>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage) {
      std::vector<lunasvg::Point,std::allocator<lunasvg::Point>>::
      _M_realloc_insert<lunasvg::Point_const&>
                ((vector<lunasvg::Point,std::allocator<lunasvg::Point>> *)&this->m_values,__position
                 ,&local_48);
    }
    else {
      *__position._M_current = local_48;
      ppPVar1 = &(this->m_values).
                 super__Vector_base<lunasvg::Point,_std::allocator<lunasvg::Point>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppPVar1 = *ppPVar1 + 1;
    }
    skipOptionalSpacesOrDelimiter(&local_40,',');
  } while (local_40._M_len != 0);
  return true;
}

Assistant:

bool SVGPointList::parse(std::string_view input)
{
    m_values.clear();
    stripLeadingSpaces(input);
    while(!input.empty()) {
        Point value;
        if(!parseNumber(input, value.x)
            || !skipOptionalSpacesOrComma(input)
            || !parseNumber(input, value.y)) {
            return false;
        }

        m_values.push_back(value);
        skipOptionalSpacesOrComma(input);
    }

    return true;
}